

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delete.cpp
# Opt level: O2

void __thiscall
duckdb::DeleteLocalState::DeleteLocalState
          (DeleteLocalState *this,ClientContext *context,TableCatalogEntry *table,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints)

{
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *pvVar1;
  undefined8 __p;
  int iVar2;
  Allocator *allocator;
  undefined4 extraout_var;
  allocator_type local_79;
  undefined1 local_78 [16];
  AttachedDatabase *local_68;
  vector<bool,_true> initialize;
  
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.batch_index.index + 4) =
       0xffffffff;
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.min_batch_index.index + 4) =
       0xffffffff;
  pvVar1 = &(this->super_LocalSinkState).partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LocalSinkState).partition_info.partition_data.
  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__DeleteLocalState_017a4830;
  DataChunk::DataChunk(&this->delete_chunk);
  (this->delete_state).
  super_unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
  .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl = (TableDeleteState *)0x0;
  TableCatalogEntry::GetTypes((vector<duckdb::LogicalType,_true> *)(local_78 + 8),table);
  local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&initialize,
             ((long)local_68 - local_78._8_8_) / 0x18,(bool *)local_78,&local_79);
  allocator = Allocator::Get(context);
  DataChunk::Initialize
            (&this->delete_chunk,allocator,(vector<duckdb::LogicalType,_true> *)(local_78 + 8),
             &initialize,0x800);
  iVar2 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])(table);
  DataTable::InitializeDelete
            ((DataTable *)local_78,(TableCatalogEntry *)CONCAT44(extraout_var,iVar2),
             (ClientContext *)table,
             (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
              *)context);
  __p = local_78._0_8_;
  local_78._0_8_ =
       (__uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>)
       0x0;
  ::std::__uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>::
  reset((__uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_> *
        )&this->delete_state,(pointer)__p);
  ::std::unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>::
  ~unique_ptr((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>
               *)local_78);
  ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&initialize);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_78 + 8));
  return;
}

Assistant:

DeleteLocalState(ClientContext &context, TableCatalogEntry &table,
	                 const vector<unique_ptr<BoundConstraint>> &bound_constraints) {
		const auto &types = table.GetTypes();
		auto initialize = vector<bool>(types.size(), false);
		delete_chunk.Initialize(Allocator::Get(context), types, initialize);

		auto &storage = table.GetStorage();
		delete_state = storage.InitializeDelete(table, context, bound_constraints);
	}